

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

string * __thiscall
flatbuffers::java::JavaGenerator::GenConcreteTypeGet_ObjectAPI_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type)

{
  string *psVar1;
  BaseType BVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string new_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  GenTypeNameDest_abi_cxx11_(__return_storage_ptr__,this,type);
  BVar2 = type->base_type;
  if (BVar2 - BASE_TYPE_VECTOR < 2) {
LAB_001bf846:
    if (type->struct_def != (StructDef *)0x0) {
      psVar1 = (string *)(type->struct_def->super_Definition).name._M_string_length;
      (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_80,&this->namer_);
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,
                 __return_storage_ptr__->_M_string_length - (long)psVar1,psVar1);
      this_00 = &local_80;
      goto LAB_001bf94c;
    }
    if (type->element == BASE_TYPE_UNION) {
      IdlNamer::NamespacedType_abi_cxx11_(&local_60,&this->namer_,&type->enum_def->super_Definition)
      ;
      std::operator+(&local_40,&this->package_prefix_,&local_60);
      std::operator+(&local_80,&local_40,"Union");
      goto LAB_001bf925;
    }
  }
  else {
    if (BVar2 != BASE_TYPE_UNION) {
      if (BVar2 != BASE_TYPE_ARRAY) goto LAB_001bf954;
      goto LAB_001bf846;
    }
    IdlNamer::NamespacedType_abi_cxx11_(&local_60,&this->namer_,&type->enum_def->super_Definition);
    std::operator+(&local_40,&this->package_prefix_,&local_60);
    std::operator+(&local_80,&local_40,"Union");
LAB_001bf925:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    this_00 = &local_60;
LAB_001bf94c:
    std::__cxx11::string::~string((string *)this_00);
  }
  BVar2 = type->base_type;
LAB_001bf954:
  if ((BVar2 == BASE_TYPE_ARRAY) || (BVar2 == BASE_TYPE_VECTOR)) {
    std::operator+(&local_80,__return_storage_ptr__,"[]");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenConcreteTypeGet_ObjectAPI(
      const flatbuffers::Type &type) const {
    auto type_name = GenTypeNameDest(type);
    // Replace to ObjectBaseAPI Type Name
    switch (type.base_type) {
      case BASE_TYPE_STRUCT: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();   // fall thru
      case BASE_TYPE_VECTOR: {
        if (type.struct_def != nullptr) {
          auto type_name_length = type.struct_def->name.length();
          auto new_type_name = namer_.ObjectType(*type.struct_def);
          type_name.replace(type_name.length() - type_name_length,
                            type_name_length, new_type_name);
        } else if (type.element == BASE_TYPE_UNION) {
          type_name = Prefixed(namer_.NamespacedType(*type.enum_def)) + "Union";
        }
        break;
      }

      case BASE_TYPE_UNION: {
        type_name = Prefixed(namer_.NamespacedType(*type.enum_def)) + "Union";
        break;
      }
      default: break;
    }

    switch (type.base_type) {
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_VECTOR: {
        type_name = type_name + "[]";
        break;
      }
      default: break;
    }
    return type_name;
  }